

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toFloat.cpp
# Opt level: O0

int main(void)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  uint uVar3;
  ostream *poVar4;
  int i;
  int iMax;
  undefined8 in_stack_ffffffffffffffd8;
  ios_base *in_stack_ffffffffffffffe0;
  int local_c;
  
  std::ios_base::precision((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),9);
  std::ios_base::setf(in_stack_ffffffffffffffe0,(fmtflags)((ulong)in_stack_ffffffffffffffd8 >> 0x20)
                      ,(fmtflags)in_stack_ffffffffffffffd8);
  std::operator<<((ostream *)&std::cout,
                  "//\n// This is an automatically generated file.\n// Do not edit.\n//\n\n");
  std::operator<<((ostream *)&std::cout,"{\n    ");
  for (local_c = 0; local_c < 0x10000; local_c = local_c + 1) {
    poVar4 = std::operator<<((ostream *)&std::cout,"{0x");
    _Var1 = std::setfill<char>('0');
    poVar4 = std::operator<<(poVar4,_Var1._M_c);
    _Var2 = std::setw(8);
    poVar4 = std::operator<<(poVar4,_Var2);
    uVar3 = halfToFloat((unsigned_short)local_c);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar3);
    std::operator<<(poVar4,"}, ");
    if ((local_c % 4 == 3) && (std::operator<<((ostream *)&std::cout,"\n"), local_c < 0xffff)) {
      std::operator<<((ostream *)&std::cout,"    ");
    }
  }
  std::operator<<((ostream *)&std::cout,"};\n");
  return 0;
}

Assistant:

int
main ()
{
    cout.precision (9);
    cout.setf (ios_base::hex, ios_base::basefield);

    cout << "//\n"
	    "// This is an automatically generated file.\n"
	    "// Do not edit.\n"
	    "//\n\n";

    cout << "{\n    ";

    const int iMax = (1 << 16);

    for (int i = 0; i < iMax; i++)
    {
	cout << "{0x" << setfill ('0') << setw (8) << halfToFloat (i) << "}, ";

	if (i % 4 == 3)
	{
	    cout << "\n";

	    if (i < iMax - 1)
		cout << "    ";
	}
    }

    cout << "};\n";
    return 0;
}